

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  char *pcVar1;
  _Bool *local_60;
  hostname *host;
  hostname *connhost;
  Curl_dns_entry *hostaddr;
  timediff_t tStack_38;
  int rc;
  timediff_t timeout_ms;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *async_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  timeout_ms._4_4_ = CURLE_OK;
  p_Stack_28 = async;
  async_local = (_Bool *)conn;
  conn_local = (connectdata *)data;
  tStack_38 = Curl_timeleft(data,(curltime *)0x0,true);
  if ((*(uint *)(async_local + 0x3ac) >> 1 & 1) == 0) {
    if ((*(uint *)(async_local + 0x3ac) >> 4 & 1) == 0) {
      if ((*(uint *)(async_local + 0x3ac) >> 2 & 1) == 0) {
        host = (hostname *)(async_local + 0xc0);
      }
      else {
        host = (hostname *)(async_local + 0xf0);
      }
      if ((*(uint *)(async_local + 0x3ac) >> 3 & 1) == 0) {
        *(long *)(async_local + 400) = (long)*(int *)(async_local + 0x198);
      }
      else {
        *(long *)(async_local + 400) = (long)*(int *)(async_local + 0x19c);
      }
      pcVar1 = (*Curl_cstrdup)(host->name);
      *(char **)(async_local + 0xe0) = pcVar1;
      if (*(long *)(async_local + 0xe0) == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      hostaddr._4_4_ =
           Curl_resolv_timeout((connectdata *)async_local,*(char **)(async_local + 0xe0),
                               (int)*(undefined8 *)(async_local + 400),(Curl_dns_entry **)&connhost,
                               tStack_38);
      if (hostaddr._4_4_ == 1) {
        *p_Stack_28 = true;
      }
      else if (hostaddr._4_4_ == -2) {
        timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
      }
      else if (connhost == (hostname *)0x0) {
        Curl_failf((Curl_easy *)conn_local,"Couldn\'t resolve host \'%s\'",host->dispname);
        timeout_ms._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
      }
    }
    else {
      if ((*(uint *)(async_local + 0x3ac) >> 6 & 1) == 0) {
        local_60 = async_local + 0x150;
      }
      else {
        local_60 = async_local + 0x110;
      }
      pcVar1 = (*Curl_cstrdup)(*(char **)(local_60 + 0x10));
      *(char **)(async_local + 0xe0) = pcVar1;
      if (*(long *)(async_local + 0xe0) == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      hostaddr._4_4_ =
           Curl_resolv_timeout((connectdata *)async_local,*(char **)(async_local + 0xe0),
                               (int)*(undefined8 *)(async_local + 400),(Curl_dns_entry **)&connhost,
                               tStack_38);
      if (hostaddr._4_4_ == 1) {
        *p_Stack_28 = true;
      }
      else if (hostaddr._4_4_ == -2) {
        timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
      }
      else if (connhost == (hostname *)0x0) {
        Curl_failf((Curl_easy *)conn_local,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)(local_60 + 0x18));
        timeout_ms._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    *(hostname **)(async_local + 0x68) = connhost;
  }
  else {
    *p_Stack_28 = false;
  }
  return timeout_ms._4_4_;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

  DEBUGASSERT(conn);
  DEBUGASSERT(data);
  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

#ifdef USE_UNIX_SOCKETS
    if(conn->unix_domain_socket) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = conn->unix_domain_socket;

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else {
        bool longpath = FALSE;
        hostaddr->addr = Curl_unix2addr(path, &longpath,
                                        conn->abstract_unix_socket);
        if(hostaddr->addr)
          hostaddr->inuse++;
        else {
          /* Long paths are not supported for now */
          if(longpath) {
            failf(data, "Unix socket path too long: '%s'", path);
            result = CURLE_COULDNT_RESOLVE_HOST;
          }
          else
            result = CURLE_OUT_OF_MEMORY;
          free(hostaddr);
          hostaddr = NULL;
        }
      }
    }
    else
#endif
    if(!conn->bits.proxy) {
      struct hostname *connhost;
      if(conn->bits.conn_to_host)
        connhost = &conn->conn_to_host;
      else
        connhost = &conn->host;

      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      if(conn->bits.conn_to_port)
        conn->port = conn->conn_to_port;
      else
        conn->port = conn->remote_port;

      /* Resolve target host right on */
      conn->hostname_resolve = strdup(connhost->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", connhost->dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      struct hostname * const host = conn->bits.socksproxy ?
        &conn->socks_proxy.host : &conn->http_proxy.host;

      /* resolve proxy */
      conn->hostname_resolve = strdup(host->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", host->dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}